

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.c
# Opt level: O1

int main(void)

{
  int iVar1;
  int in_ECX;
  undefined4 in_register_0000000c;
  int in_EDX;
  int family;
  int sock;
  int sock_00;
  int sock_01;
  int sock_02;
  int in_ESI;
  int line;
  nn_thread thread;
  nn_thread local_20;
  
  sb = test_socket_impl((char *)0x37,in_ESI,in_EDX,in_ECX);
  line = 0x102178;
  iVar1 = nn_bind(sb);
  if (iVar1 < 0) {
    main_cold_2();
  }
  else {
    sc = test_socket_impl((char *)0x39,line,family,in_ECX);
    iVar1 = nn_connect(sc,"inproc://a");
    if (-1 < iVar1) {
      nn_thread_init(&local_20,worker,(void *)0x0);
      test_recv_impl((char *)0x3e,sb,sock,(char *)CONCAT44(in_register_0000000c,in_ECX));
      test_recv_impl((char *)0x3f,sb,sock_00,(char *)CONCAT44(in_register_0000000c,in_ECX));
      nn_thread_term(&local_20);
      test_close_impl((char *)0x43,sc,sock_01);
      test_close_impl((char *)0x44,sb,sock_02);
      return 0;
    }
  }
  main_cold_1();
}

Assistant:

int main ()
{
    struct nn_thread thread;

    sb = test_socket (AF_SP, NN_PAIR);
    test_bind (sb, SOCKET_ADDRESS);
    sc = test_socket (AF_SP, NN_PAIR);
    test_connect (sc, SOCKET_ADDRESS);

    nn_thread_init (&thread, worker, NULL);

    test_recv (sb, "ABC");
    test_recv (sb, "ABC");

    nn_thread_term (&thread);

    test_close (sc);
    test_close (sb);

    return 0;
}